

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaCheckCTComponent(xmlSchemaParserCtxtPtr ctxt,xmlSchemaTypePtr type)

{
  xmlSchemaContentType xVar1;
  xmlSchemaTypePtr pxVar2;
  xmlSchemaItemListPtr list;
  void *item;
  bool bVar3;
  int iVar4;
  void **ppvVar5;
  int *piVar6;
  xmlChar *pxVar7;
  xmlChar *str2;
  long lVar8;
  xmlNodePtr node;
  long lVar9;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  int iVar13;
  xmlChar *local_50;
  int local_44;
  xmlSchemaTypePtr local_40;
  xmlChar *local_38;
  
  pxVar2 = type->baseType;
  if ((pxVar2 != (xmlSchemaTypePtr)0x0) &&
     (((pxVar2->type == XML_SCHEMA_TYPE_SIMPLE ||
       ((pxVar2->type == XML_SCHEMA_TYPE_BASIC && (pxVar2->builtInType != 0x2d)))) &&
      ((type->flags & 2) == 0)))) {
    xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_SRC_CT_1,(xmlNodePtr)0x0,
                        (xmlSchemaBasicItemPtr)type,
                        "If the base type is a simple type, the derivation method must be \'extension\'"
                        ,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
    return 0xc04;
  }
  list = (xmlSchemaItemListPtr)type->attrUses;
  if (list != (xmlSchemaItemListPtr)0x0) {
    iVar13 = list->nbItems;
    if (1 < (long)iVar13) {
      uVar10 = iVar13 - 2;
      local_44 = 0;
      lVar9 = (long)iVar13;
      local_40 = type;
      do {
        iVar13 = iVar13 + -1;
        item = list->items[lVar9 + -1];
        iVar4 = (int)(lVar9 + -1);
        if (lVar9 == 1) {
          lVar8 = *(long *)((long)item + 0x18);
        }
        else {
          lVar8 = *(long *)((long)item + 0x18);
          ppvVar5 = list->items + uVar10;
          iVar11 = iVar13;
          do {
            if ((*(long *)(lVar8 + 0x10) == *(long *)(*(long *)((long)*ppvVar5 + 0x18) + 0x10)) &&
               (*(long *)(lVar8 + 0x70) == *(long *)(*(long *)((long)*ppvVar5 + 0x18) + 0x70))) {
              local_50 = (xmlChar *)0x0;
              pxVar7 = xmlSchemaGetComponentDesignation(&local_50,item);
              type = local_40;
              xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_AG_PROPS_CORRECT,
                                  (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)local_40,"Duplicate %s",
                                  pxVar7,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
              if (local_50 != (xmlChar *)0x0) {
                (*xmlFree)(local_50);
              }
              iVar4 = xmlSchemaItemListRemove(list,iVar4);
              goto LAB_001a5420;
            }
            iVar11 = iVar11 + -1;
            ppvVar5 = ppvVar5 + -1;
          } while (0 < iVar11);
        }
        piVar6 = *(int **)(lVar8 + 0x60);
LAB_001a5313:
        if (((piVar6 == (int *)0x0) || (*piVar6 == 5)) || (iVar11 = piVar6[0x28], iVar11 == 0x2d))
        goto LAB_001a5429;
        if (*piVar6 != 1) {
LAB_001a5349:
          piVar6 = *(int **)(piVar6 + 0xe);
          goto LAB_001a5313;
        }
        if (iVar11 != 0x17) {
          if (iVar11 == 0x2e) goto LAB_001a5429;
          goto LAB_001a5349;
        }
        if (local_44 == 0) {
          local_44 = 1;
        }
        else {
          local_50 = (xmlChar *)0x0;
          pxVar7 = xmlSchemaGetComponentDesignation(&local_50,item);
          type = local_40;
          xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_AG_PROPS_CORRECT,
                              (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)local_40,
                              "There must not exist more than one attribute declaration of type \'xs:ID\' (or derived from \'xs:ID\'). The %s violates this constraint"
                              ,pxVar7,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
          if (local_50 != (xmlChar *)0x0) {
            (*xmlFree)(local_50);
          }
          iVar4 = xmlSchemaItemListRemove(list,iVar4);
          local_44 = 1;
LAB_001a5420:
          if (iVar4 == -1) {
            return -1;
          }
        }
LAB_001a5429:
        uVar10 = uVar10 - 1;
        bVar3 = 1 < lVar9;
        lVar9 = lVar9 + -1;
      } while (bVar3);
    }
  }
  pxVar2 = type->baseType;
  if ((type->flags & 2) != 0) {
    if ((pxVar2->type == XML_SCHEMA_TYPE_COMPLEX) || (pxVar2->builtInType == 0x2d)) {
      if ((pxVar2->flags & 0x200) == 0) {
        if ((type->contentTypeDef != (xmlSchemaTypePtr)0x0) &&
           (type->contentTypeDef == pxVar2->contentTypeDef)) {
          return 0;
        }
        xVar1 = type->contentType;
        if ((xVar1 == XML_SCHEMA_CONTENT_EMPTY) && (pxVar2->contentType == XML_SCHEMA_CONTENT_EMPTY)
           ) {
          return 0;
        }
        if (type->subtypes == (xmlSchemaTypePtr)0x0) {
          pcVar12 = "The content type must specify a particle";
        }
        else {
          if (pxVar2->contentType == XML_SCHEMA_CONTENT_EMPTY) {
            return 0;
          }
          if ((xVar1 & ~XML_SCHEMA_CONTENT_EMPTY) == XML_SCHEMA_CONTENT_ELEMENTS &&
              pxVar2->contentType == xVar1) {
            return 0;
          }
          pcVar12 = 
          "The content type of both, the type and its base type, must either \'mixed\' or \'element-only\'"
          ;
        }
        goto LAB_001a56bc;
      }
    }
    else {
      if (type->contentTypeDef != pxVar2) {
        pcVar12 = "The content type must be the simple base type";
        goto LAB_001a56bc;
      }
      if ((pxVar2->flags & 0x200) == 0) {
        return 0;
      }
    }
    pcVar12 = "The \'final\' of the base type definition contains \'extension\'";
LAB_001a56bc:
    xmlSchemaPCustomErrExt
              (ctxt,XML_SCHEMAP_COS_CT_EXTENDS_1_1,(xmlSchemaBasicItemPtr)type,(xmlNodePtr)0x0,
               pcVar12,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
    return 0xbf7;
  }
  if ((pxVar2->type == XML_SCHEMA_TYPE_COMPLEX) || (pxVar2->builtInType == 0x2d)) {
    if ((pxVar2->flags & 0x400) != 0) {
      node = type->node;
      pcVar12 = "The \'final\' of the base type definition contains \'restriction\'";
      goto LAB_001a5674;
    }
    iVar13 = 0;
    iVar4 = xmlSchemaCheckDerivationOKRestriction2to4
                      (ctxt,0,(xmlSchemaBasicItemPtr)type,(xmlSchemaBasicItemPtr)pxVar2,
                       (xmlSchemaItemListPtr)type->attrUses,(xmlSchemaItemListPtr)pxVar2->attrUses,
                       type->attributeWildcard,pxVar2->attributeWildcard);
    if (iVar4 == -1) {
      return -1;
    }
    if (pxVar2->builtInType == 0x2d) {
      return 0;
    }
    switch(type->contentType) {
    case XML_SCHEMA_CONTENT_EMPTY:
      if (pxVar2->contentType - XML_SCHEMA_CONTENT_ELEMENTS < 2) {
        iVar13 = xmlSchemaIsParticleEmptiable((xmlSchemaParticlePtr)pxVar2->subtypes);
        if (iVar13 != 0) {
          return 0;
        }
      }
      else if (pxVar2->contentType == XML_SCHEMA_CONTENT_EMPTY) {
        return 0;
      }
      pcVar12 = 
      "The content type of the base type must be either empty or \'mixed\' (or \'elements-only\') and an emptiable particle"
      ;
      break;
    case XML_SCHEMA_CONTENT_ELEMENTS:
      goto switchD_001a54e1_caseD_2;
    case XML_SCHEMA_CONTENT_MIXED:
      if (pxVar2->contentType == XML_SCHEMA_CONTENT_MIXED) {
        return 0;
      }
      pcVar12 = 
      "If the content type is \'mixed\', then the content type of the base type must also be \'mixed\'"
      ;
      break;
    case XML_SCHEMA_CONTENT_SIMPLE:
    case XML_SCHEMA_CONTENT_BASIC:
      xVar1 = pxVar2->contentType;
      if (xVar1 == XML_SCHEMA_CONTENT_MIXED) {
        iVar13 = xmlSchemaIsParticleEmptiable((xmlSchemaParticlePtr)pxVar2->subtypes);
        if (iVar13 != 0) {
          return 0;
        }
      }
      else if ((xVar1 == XML_SCHEMA_CONTENT_BASIC) || (xVar1 == XML_SCHEMA_CONTENT_SIMPLE)) {
        iVar13 = xmlSchemaCheckCOSSTDerivedOK
                           ((xmlSchemaAbstractCtxtPtr)ctxt,type->contentTypeDef,
                            pxVar2->contentTypeDef,0);
        if (iVar13 == 0) {
          return 0;
        }
        local_50 = (xmlChar *)0x0;
        local_38 = (xmlChar *)0x0;
        if (iVar13 == -1) {
          return -1;
        }
        pxVar7 = xmlSchemaGetComponentDesignation(&local_50,type->contentTypeDef);
        str2 = xmlSchemaGetComponentDesignation(&local_38,pxVar2->contentTypeDef);
        xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_DERIVATION_OK_RESTRICTION_1,
                            (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)type,
                            "The {content type} %s is not validly derived from the base type\'s {content type} %s"
                            ,pxVar7,str2,(xmlChar *)0x0,(xmlChar *)0x0);
        if (local_50 != (xmlChar *)0x0) {
          (*xmlFree)(local_50);
        }
        if (local_38 != (xmlChar *)0x0) {
          (*xmlFree)(local_38);
        }
        return ctxt->err;
      }
      pcVar12 = 
      "The content type of the base type must be either a simple type or \'mixed\' and an emptiable particle"
      ;
      break;
    default:
      pcVar12 = "The type is not a valid restriction of its base type";
    }
    xmlSchemaPCustomErrExt
              (ctxt,XML_SCHEMAP_DERIVATION_OK_RESTRICTION_1,(xmlSchemaBasicItemPtr)type,
               (xmlNodePtr)0x0,pcVar12,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
  }
  else {
    node = type->node;
    pcVar12 = "The base type must be a complex type";
LAB_001a5674:
    xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_DERIVATION_OK_RESTRICTION_1,node,
                        (xmlSchemaBasicItemPtr)type,pcVar12,(xmlChar *)0x0,(xmlChar *)0x0,
                        (xmlChar *)0x0,(xmlChar *)0x0);
  }
  iVar13 = ctxt->err;
switchD_001a54e1_caseD_2:
  return iVar13;
}

Assistant:

static int
xmlSchemaCheckCTComponent(xmlSchemaParserCtxtPtr ctxt,
			  xmlSchemaTypePtr type)
{
    int ret;
    /*
    * Complex Type Definition Properties Correct
    */
    ret = xmlSchemaCheckCTPropsCorrect(ctxt, type);
    if (ret != 0)
	return (ret);
    if (WXS_IS_EXTENSION(type))
	ret = xmlSchemaCheckCOSCTExtends(ctxt, type);
    else
	ret = xmlSchemaCheckDerivationOKRestriction(ctxt, type);
    return (ret);
}